

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype __thiscall QtPrivate::count(QtPrivate *this,QStringView haystack,QRegularExpression *re)

{
  bool bVar1;
  QRegularExpression *this_00;
  qsizetype qVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QStringView subjectView;
  QRegularExpressionMatch match;
  QString local_50;
  long local_38;
  
  this_00 = (QRegularExpression *)haystack.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QRegularExpression::isValid(this_00);
  if (bVar1) {
    qVar2 = -1;
    qVar3 = 0;
    do {
      if ((long)this <= qVar2) break;
      local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      subjectView.m_data = (storage_type_conflict *)this;
      subjectView.m_size = (qsizetype)this_00;
      QRegularExpression::matchView
                ((QRegularExpression *)&local_50,subjectView,haystack.m_size,
                 (int)qVar2 + PartialPreferCompleteMatch,(MatchOptions)0x0);
      bVar1 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)&local_50);
      if (bVar1) {
        qVar2 = QRegularExpressionMatch::capturedStart((QRegularExpressionMatch *)&local_50,0);
        qVar3 = qVar3 + 1;
        if (qVar2 < (long)this) {
          qVar2 = qVar2 + (ulong)((*(ushort *)(haystack.m_size + qVar2 * 2) & 0xfc00) == 0xd800);
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_50);
    } while (bVar1);
  }
  else {
    QRegularExpression::pattern(&local_50,this_00);
    qtWarnAboutInvalidRegularExpression(&local_50,"QString(View)::count");
    count((QtPrivate *)&local_50);
    qVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar3;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, const QRegularExpression &re)
{
    if (!re.isValid()) {
        qtWarnAboutInvalidRegularExpression(re.pattern(), "QString(View)::count");
        return 0;
    }
    qsizetype count = 0;
    qsizetype index = -1;
    qsizetype len = haystack.size();
    while (index <= len - 1) {
        QRegularExpressionMatch match = re.matchView(haystack, index + 1);
        if (!match.hasMatch())
            break;
        count++;

        // Search again, from the next character after the beginning of this
        // capture. If the capture starts with a surrogate pair, both together
        // count as "one character".
        index = match.capturedStart();
        if (index < len && haystack[index].isHighSurrogate())
            ++index;
    }
    return count;
}